

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

FillStaticLayerParams * __thiscall
CoreML::Specification::FillStaticLayerParams::New(FillStaticLayerParams *this,Arena *arena)

{
  FillStaticLayerParams *this_00;
  
  this_00 = (FillStaticLayerParams *)operator_new(0x30);
  FillStaticLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FillStaticLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

FillStaticLayerParams* FillStaticLayerParams::New(::google::protobuf::Arena* arena) const {
  FillStaticLayerParams* n = new FillStaticLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}